

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O3

void __thiscall irr::io::CFileSystem::CFileSystem(CFileSystem *this,void **vtt)

{
  _func_int **pp_Var1;
  long lVar2;
  CArchiveLoaderZIP *this_00;
  CArchiveLoaderZIP *local_20;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IFileSystem)._vptr_IFileSystem = pp_Var1;
  *(void **)((long)&(this->super_IFileSystem)._vptr_IFileSystem + (long)pp_Var1[-3]) = vtt[2];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IFileSystem)._vptr_IFileSystem = pp_Var1;
  *(void **)((long)&(this->super_IFileSystem)._vptr_IFileSystem + (long)pp_Var1[-3]) = vtt[3];
  lVar2 = 0x20;
  do {
    *(long *)((long)this + lVar2 + -0x10) =
         (long)&(this->super_IFileSystem)._vptr_IFileSystem + lVar2;
    *(undefined8 *)((long)this + lVar2 + -8) = 0;
    *(undefined1 *)((long)&(this->super_IFileSystem)._vptr_IFileSystem + lVar2) = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x60);
  (this->ArchiveLoader).m_data.
  super__Vector_base<irr::io::IArchiveLoader_*,_std::allocator<irr::io::IArchiveLoader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ArchiveLoader).m_data.
  super__Vector_base<irr::io::IArchiveLoader_*,_std::allocator<irr::io::IArchiveLoader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ArchiveLoader).m_data.
  super__Vector_base<irr::io::IArchiveLoader_*,_std::allocator<irr::io::IArchiveLoader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ArchiveLoader).is_sorted = true;
  (this->FileArchives).m_data.
  super__Vector_base<irr::io::IFileArchive_*,_std::allocator<irr::io::IFileArchive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FileArchives).m_data.
  super__Vector_base<irr::io::IFileArchive_*,_std::allocator<irr::io::IFileArchive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FileArchives).m_data.
  super__Vector_base<irr::io::IFileArchive_*,_std::allocator<irr::io::IFileArchive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FileArchives).is_sorted = true;
  (*(this->super_IFileSystem)._vptr_IFileSystem[0x1a])(this,0);
  (*(this->super_IFileSystem)._vptr_IFileSystem[0x11])(this);
  this_00 = (CArchiveLoaderZIP *)operator_new(0x28);
  CArchiveLoaderZIP::CArchiveLoaderZIP(this_00,&this->super_IFileSystem);
  local_20 = this_00;
  ::std::vector<irr::io::IArchiveLoader*,std::allocator<irr::io::IArchiveLoader*>>::
  emplace_back<irr::io::IArchiveLoader*>
            ((vector<irr::io::IArchiveLoader*,std::allocator<irr::io::IArchiveLoader*>> *)
             &this->ArchiveLoader,(IArchiveLoader **)&local_20);
  (this->ArchiveLoader).is_sorted = false;
  return;
}

Assistant:

CFileSystem::CFileSystem()
{
#ifdef _DEBUG
	setDebugName("CFileSystem");
#endif

	setFileListSystem(FILESYSTEM_NATIVE);
	//! reset current working directory
	getWorkingDirectory();

	ArchiveLoader.push_back(new CArchiveLoaderZIP(this));
}